

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O2

immutable_string __thiscall
ut::test_case_impl<agge::tests::RendererTests>::name
          (test_case_impl<agge::tests::RendererTests> *this)

{
  DeleterF extraout_RDX;
  long in_RSI;
  immutable_string iVar1;
  
  exportable::immutable_basic_string<char>::immutable_basic_string
            ((immutable_basic_string<char> *)this,(immutable_basic_string<char> *)(in_RSI + 0x18));
  iVar1._deleter = extraout_RDX;
  iVar1._text = (char *)this;
  return iVar1;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::name() const
	{	return _name;	}